

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O0

void test_bson_json_read_raw_utf8(void)

{
  FILE *pFVar1;
  byte bVar2;
  int iVar3;
  char *pcVar4;
  undefined8 uVar5;
  bson_iter_t iter;
  bson_t *bson;
  undefined1 local_100 [104];
  long local_98;
  
  local_98 = bson_new_from_json(anon_var_dwarf_c745,0xffffffffffffffff,0);
  if (local_98 == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x40d,"test_bson_json_read_raw_utf8","bson");
    abort();
  }
  bVar2 = bson_iter_init_find(local_100,local_98,anon_var_dwarf_344b + 0xc);
  if ((bVar2 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x40e,"test_bson_json_read_raw_utf8","bson_iter_init_find (&iter, bson, EU)");
    abort();
  }
  pcVar4 = (char *)bson_iter_key(local_100);
  if (pcVar4 != anon_var_dwarf_344b + 0xc) {
    pcVar4 = (char *)bson_iter_key(local_100);
    iVar3 = strcmp(pcVar4,anon_var_dwarf_344b + 0xc);
    pFVar1 = _stderr;
    if (iVar3 != 0) {
      uVar5 = bson_iter_key(local_100);
      fprintf(pFVar1,"FAIL\n\nAssert Failure: \"%s\" != \"%s\"\n",uVar5,anon_var_dwarf_344b + 0xc);
      abort();
    }
  }
  pcVar4 = (char *)bson_iter_utf8(local_100,0);
  if (pcVar4 != anon_var_dwarf_344b + 0xc) {
    pcVar4 = (char *)bson_iter_utf8(local_100,0);
    iVar3 = strcmp(pcVar4,anon_var_dwarf_344b + 0xc);
    pFVar1 = _stderr;
    if (iVar3 != 0) {
      uVar5 = bson_iter_utf8(local_100,0);
      fprintf(pFVar1,"FAIL\n\nAssert Failure: \"%s\" != \"%s\"\n",uVar5,anon_var_dwarf_344b + 0xc);
      abort();
    }
  }
  bVar2 = bson_iter_next(local_100);
  if (((bVar2 ^ 0xff) & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x411,"test_bson_json_read_raw_utf8","!bson_iter_next (&iter)");
    abort();
  }
  bson_destroy(local_98);
  return;
}

Assistant:

static void
test_bson_json_read_raw_utf8 (void)
{
   bson_t *bson;
   bson_iter_t iter;

   bson = bson_new_from_json (
      (const uint8_t *) "{\"" EU "\": \"" EU "\"}", -1, NULL);
   ASSERT (bson);
   ASSERT (bson_iter_init_find (&iter, bson, EU));
   ASSERT_CMPSTR (bson_iter_key (&iter), EU);
   ASSERT_CMPSTR (bson_iter_utf8 (&iter, NULL), EU);
   ASSERT (!bson_iter_next (&iter));

   bson_destroy (bson);
}